

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image_writer.cpp
# Opt level: O1

void errorFn(png_structp png_ptr,png_const_charp error_msg)

{
  string *this;
  long *plVar1;
  long *plVar2;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  this = (string *)png_get_error_ptr();
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"libpng error: ","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_60);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_30 = *plVar2;
    lStack_28 = plVar1[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar2;
    local_40 = (long *)*plVar1;
  }
  local_38 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=(this,(string *)&local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  return;
}

Assistant:

static void errorFn(png_structp png_ptr, png_const_charp error_msg)
{
    auto* errorStr = static_cast<std::string*>(png_get_error_ptr(png_ptr));
    *errorStr = std::string("libpng error: ") + error_msg;
}